

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O0

char * ngx_http_log_compile_format
                 (ngx_conf_t *cf,ngx_array_t *flushes,ngx_array_t *ops,ngx_array_t *args,
                 ngx_uint_t s)

{
  byte bVar1;
  int iVar2;
  char *__s1;
  ngx_http_log_op_t *op_00;
  void *__src;
  size_t sVar3;
  ngx_int_t nVar4;
  uintptr_t *puVar5;
  void *__dest;
  ngx_str_t *pnVar6;
  bool bVar7;
  ngx_http_log_var_t *local_a0;
  ngx_http_log_var_t *v;
  ngx_http_log_op_t *op;
  ngx_uint_t json;
  ngx_uint_t bracket;
  ngx_int_t *flush;
  ngx_str_t var;
  ngx_str_t *value;
  size_t len;
  size_t i;
  u_char ch;
  u_char *p;
  u_char *data;
  ngx_uint_t s_local;
  ngx_array_t *args_local;
  ngx_array_t *ops_local;
  ngx_array_t *flushes_local;
  ngx_conf_t *cf_local;
  
  op = (ngx_http_log_op_t *)0x0;
  var.data = (u_char *)args->elts;
  data = (u_char *)s;
  if ((s < args->nelts) &&
     (iVar2 = strncmp(*(char **)(var.data + s * 0x10 + 8),"escape=",7), iVar2 == 0)) {
    __s1 = (char *)(*(long *)(var.data + s * 0x10 + 8) + 7);
    iVar2 = strcmp(__s1,"json");
    if (iVar2 == 0) {
      op = (ngx_http_log_op_t *)&DAT_00000001;
    }
    else {
      iVar2 = strcmp(__s1,"default");
      if (iVar2 != 0) {
        ngx_conf_log_error(1,cf,0,"unknown log format escaping \"%s\"",__s1);
        return (char *)0xffffffffffffffff;
      }
    }
    data = (u_char *)(s + 1);
  }
  do {
    if ((u_char *)args->nelts <= data) {
      return (char *)0x0;
    }
    len = 0;
LAB_0017021d:
    if (len < *(ulong *)(var.data + (long)data * 0x10)) {
      op_00 = (ngx_http_log_op_t *)ngx_array_push(ops);
      if (op_00 == (ngx_http_log_op_t *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      __src = (void *)(*(long *)(var.data + (long)data * 0x10 + 8) + len);
      if (*(char *)(*(long *)(var.data + (long)data * 0x10 + 8) + len) == '$') {
        sVar3 = len + 1;
        if (sVar3 == *(size_t *)(var.data + (long)data * 0x10)) {
LAB_0017072a:
          ngx_conf_log_error(1,cf,0,"invalid parameter \"%s\"",__src);
          return (char *)0xffffffffffffffff;
        }
        if (*(char *)(*(long *)(var.data + (long)data * 0x10 + 8) + sVar3) == '{') {
          bVar7 = true;
          len = len + 2;
          if (len == *(size_t *)(var.data + (long)data * 0x10)) goto LAB_0017072a;
          var.len = *(long *)(var.data + (long)data * 0x10 + 8) + len;
        }
        else {
          bVar7 = false;
          var.len = *(long *)(var.data + (long)data * 0x10 + 8) + sVar3;
          len = sVar3;
        }
        flush = (ngx_int_t *)0x0;
        for (; len < *(ulong *)(var.data + (long)data * 0x10); len = len + 1) {
          bVar1 = *(byte *)(*(long *)(var.data + (long)data * 0x10 + 8) + len);
          if ((bVar1 == 0x7d) && (bVar7)) {
            len = len + 1;
            bVar7 = false;
            break;
          }
          if ((((bVar1 < 0x41) || (0x5a < bVar1)) && ((bVar1 < 0x61 || (0x7a < bVar1)))) &&
             (((bVar1 < 0x30 || (0x39 < bVar1)) && (bVar1 != 0x5f)))) break;
          flush = (ngx_int_t *)((long)flush + 1);
        }
        if (bVar7) {
          ngx_conf_log_error(1,cf,0,"the closing bracket in \"%V\" variable is missing",&flush);
          return (char *)0xffffffffffffffff;
        }
        if (flush == (ngx_int_t *)0x0) goto LAB_0017072a;
        for (local_a0 = ngx_http_log_vars; (local_a0->name).len != 0; local_a0 = local_a0 + 1) {
          if (((ngx_int_t *)(local_a0->name).len == flush) &&
             (iVar2 = strncmp((char *)(local_a0->name).data,(char *)var.len,(size_t)flush),
             iVar2 == 0)) {
            op_00->len = local_a0->len;
            op_00->getlen = (ngx_http_log_op_getlen_pt)0x0;
            op_00->run = local_a0->run;
            op_00->data = 0;
            goto LAB_0017021d;
          }
        }
        nVar4 = ngx_http_log_variable_compile(cf,op_00,(ngx_str_t *)&flush,(ngx_uint_t)op);
        if (nVar4 != 0) {
          return (char *)0xffffffffffffffff;
        }
        if (flushes != (ngx_array_t *)0x0) {
          puVar5 = (uintptr_t *)ngx_array_push(flushes);
          if (puVar5 == (uintptr_t *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          *puVar5 = op_00->data;
        }
      }
      else {
        do {
          len = len + 1;
          bVar7 = false;
          if (len < *(ulong *)(var.data + (long)data * 0x10)) {
            bVar7 = *(char *)(*(long *)(var.data + (long)data * 0x10 + 8) + len) != '$';
          }
        } while (bVar7);
        value = (ngx_str_t *)((*(long *)(var.data + (long)data * 0x10 + 8) + len) - (long)__src);
        if (value != (ngx_str_t *)0x0) {
          op_00->len = (size_t)value;
          op_00->getlen = (ngx_http_log_op_getlen_pt)0x0;
          if (value < (ngx_str_t *)0x9) {
            op_00->run = ngx_http_log_copy_short;
            op_00->data = 0;
            while (pnVar6 = (ngx_str_t *)((long)&value[-1].data + 7), value != (ngx_str_t *)0x0) {
              op_00->data = op_00->data << 8;
              op_00->data = (ulong)*(byte *)((long)__src + (long)pnVar6) | op_00->data;
              value = pnVar6;
            }
          }
          else {
            op_00->run = ngx_http_log_copy_long;
            __dest = ngx_pnalloc(cf->pool,(size_t)value);
            if (__dest == (void *)0x0) {
              return (char *)0xffffffffffffffff;
            }
            memcpy(__dest,__src,(size_t)value);
            op_00->data = (uintptr_t)__dest;
          }
        }
      }
      goto LAB_0017021d;
    }
    data = data + 1;
  } while( true );
}

Assistant:

static char *
ngx_http_log_compile_format(ngx_conf_t *cf, ngx_array_t *flushes,
    ngx_array_t *ops, ngx_array_t *args, ngx_uint_t s)
{
    u_char              *data, *p, ch;
    size_t               i, len;
    ngx_str_t           *value, var;
    ngx_int_t           *flush;
    ngx_uint_t           bracket, json;
    ngx_http_log_op_t   *op;
    ngx_http_log_var_t  *v;

    json = 0;
    value = args->elts;

    if (s < args->nelts && ngx_strncmp(value[s].data, "escape=", 7) == 0) {
        data = value[s].data + 7;

        if (ngx_strcmp(data, "json") == 0) {
            json = 1;

        } else if (ngx_strcmp(data, "default") != 0) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "unknown log format escaping \"%s\"", data);
            return NGX_CONF_ERROR;
        }

        s++;
    }

    for ( /* void */ ; s < args->nelts; s++) {

        i = 0;

        while (i < value[s].len) {

            op = ngx_array_push(ops);
            if (op == NULL) {
                return NGX_CONF_ERROR;
            }

            data = &value[s].data[i];

            if (value[s].data[i] == '$') {

                if (++i == value[s].len) {
                    goto invalid;
                }

                if (value[s].data[i] == '{') {
                    bracket = 1;

                    if (++i == value[s].len) {
                        goto invalid;
                    }

                    var.data = &value[s].data[i];

                } else {
                    bracket = 0;
                    var.data = &value[s].data[i];
                }

                for (var.len = 0; i < value[s].len; i++, var.len++) {
                    ch = value[s].data[i];

                    if (ch == '}' && bracket) {
                        i++;
                        bracket = 0;
                        break;
                    }

                    if ((ch >= 'A' && ch <= 'Z')
                        || (ch >= 'a' && ch <= 'z')
                        || (ch >= '0' && ch <= '9')
                        || ch == '_')
                    {
                        continue;
                    }

                    break;
                }

                if (bracket) {
                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                       "the closing bracket in \"%V\" "
                                       "variable is missing", &var);
                    return NGX_CONF_ERROR;
                }

                if (var.len == 0) {
                    goto invalid;
                }

                for (v = ngx_http_log_vars; v->name.len; v++) {

                    if (v->name.len == var.len
                        && ngx_strncmp(v->name.data, var.data, var.len) == 0)
                    {
                        op->len = v->len;
                        op->getlen = NULL;
                        op->run = v->run;
                        op->data = 0;

                        goto found;
                    }
                }

                if (ngx_http_log_variable_compile(cf, op, &var, json)
                    != NGX_OK)
                {
                    return NGX_CONF_ERROR;
                }

                if (flushes) {

                    flush = ngx_array_push(flushes);
                    if (flush == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    *flush = op->data; /* variable index */
                }

            found:

                continue;
            }

            i++;

            while (i < value[s].len && value[s].data[i] != '$') {
                i++;
            }

            len = &value[s].data[i] - data;

            if (len) {

                op->len = len;
                op->getlen = NULL;

                if (len <= sizeof(uintptr_t)) {
                    op->run = ngx_http_log_copy_short;
                    op->data = 0;

                    while (len--) {
                        op->data <<= 8;
                        op->data |= data[len];
                    }

                } else {
                    op->run = ngx_http_log_copy_long;

                    p = ngx_pnalloc(cf->pool, len);
                    if (p == NULL) {
                        return NGX_CONF_ERROR;
                    }

                    ngx_memcpy(p, data, len);
                    op->data = (uintptr_t) p;
                }
            }
        }
    }

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0, "invalid parameter \"%s\"", data);

    return NGX_CONF_ERROR;
}